

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O2

void __thiscall
QSslSocket::setPrivateKey
          (QSslSocket *this,QString *fileName,KeyAlgorithm algorithm,EncodingFormat format,
          QByteArray *passPhrase)

{
  char cVar1;
  bool bVar2;
  QLoggingCategory *pQVar3;
  long in_FS_OFFSET;
  QSslKey key;
  QArrayDataPointer<char> local_68;
  char *local_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)&local_48,(QString *)fileName);
  cVar1 = QFile::open((QFile *)&local_48,1);
  if (cVar1 == '\0') {
    pQVar3 = QtPrivateLogging::lcSsl();
    if (((pQVar3->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
      local_50 = pQVar3->name;
      local_68.d._0_4_ = 2;
      local_68._4_8_ = 0;
      local_68._12_8_ = 0;
      local_68.size._4_4_ = 0;
      QMessageLogger::warning
                ((char *)&local_68,"QSslSocket::setPrivateKey: Couldn\'t open file for reading");
    }
  }
  else {
    key.d.d.ptr = (QExplicitlySharedDataPointer<QSslKeyPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QIODevice::readAll();
    QSslKey::QSslKey(&key,(QByteArray *)&local_68,algorithm,format,PrivateKey,passPhrase);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
    bVar2 = QSslKey::isNull(&key);
    if (bVar2) {
      pQVar3 = QtPrivateLogging::lcSsl();
      if (((pQVar3->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
        local_50 = pQVar3->name;
        local_68.d._0_4_ = 2;
        local_68._4_8_ = 0;
        local_68._12_8_ = 0;
        local_68.size._4_4_ = 0;
        QMessageLogger::warning
                  ((char *)&local_68,
                   "QSslSocket::setPrivateKey: The specified file does not contain a valid key");
      }
    }
    else {
      QSslKey::operator=((QSslKey *)
                         (*(long *)&(this->super_QTcpSocket).super_QAbstractSocket.field_0x8 + 0x2d8
                         ),&key);
    }
    QSslKey::~QSslKey(&key);
  }
  QFile::~QFile((QFile *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSslSocket::setPrivateKey(const QString &fileName, QSsl::KeyAlgorithm algorithm,
                               QSsl::EncodingFormat format, const QByteArray &passPhrase)
{
    QFile file(fileName);
    if (!file.open(QIODevice::ReadOnly)) {
        qCWarning(lcSsl, "QSslSocket::setPrivateKey: Couldn't open file for reading");
        return;
    }

    QSslKey key(file.readAll(), algorithm, format, QSsl::PrivateKey, passPhrase);
    if (key.isNull()) {
        qCWarning(lcSsl, "QSslSocket::setPrivateKey: "
                         "The specified file does not contain a valid key");
        return;
    }

    Q_D(QSslSocket);
    d->configuration.privateKey = key;
}